

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O2

void __thiscall xray_re::way_point_io::operator()(way_point_io *this,way_point *point,xr_writer *w)

{
  undefined1 local_14 [4];
  
  xr_writer::w_fvector3(w,&point->position);
  (*w->_vptr_xr_writer[2])(w,local_14,4);
  xr_writer::w_sz(w,&point->name);
  return;
}

Assistant:

void way_point_io::operator()(const way_point& point, xr_writer& w) const
{
	w.w_fvector3(point.position);
	w.w_u32(point.flags);
	w.w_sz(point.name);
}